

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

int ON_SubDComponentRef::Compare2(ON_SubDComponentRef **lhs,ON_SubDComponentRef **rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs != (ON_SubDComponentRef **)0x0) {
    if (rhs != (ON_SubDComponentRef **)0x0) {
      iVar1 = Compare(*lhs,*rhs);
      return iVar1;
    }
    return -1;
  }
  return 1;
}

Assistant:

int ON_SubDComponentRef::Compare2(const ON_SubDComponentRef* const* lhs, const ON_SubDComponentRef* const* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_SubDComponentRef::Compare(*lhs, *rhs);
}